

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiID ImGui::GetColumnsID(char *str_id,int columns_count)

{
  ImGuiID IVar1;
  ImGuiWindow *str;
  undefined4 in_ESI;
  long in_RDI;
  ImGuiID id;
  ImGuiWindow *window;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  str = GetCurrentWindow();
  uVar2 = in_ESI;
  if (in_RDI != 0) {
    uVar2 = 0;
  }
  PushID(in_stack_ffffffffffffffe4);
  IVar1 = ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)str,
                             (char *)CONCAT44(in_stack_ffffffffffffffe4,uVar2));
  PopID();
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetColumnsID(const char* str_id, int columns_count)
{
    ImGuiWindow* window = GetCurrentWindow();

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    return id;
}